

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_hog.c
# Opt level: O3

void * HOG_openArchive(PHYSFS_Io *io,char *name,int forWriting,int *claimed)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  void *opaque;
  void *pvVar4;
  uint uVar5;
  PHYSFS_ErrorCode errcode;
  uint uVar6;
  ulong uVar7;
  PHYSFS_uint8 buf [3];
  PHYSFS_uint32 size;
  PHYSFS_uint32 size_1;
  PHYSFS_uint32 reserved;
  char name_1 [37];
  short local_6f;
  char local_6d;
  uint local_6c;
  uint local_68;
  uint local_64;
  uint local_60;
  PHYSFS_uint32 local_5c;
  char local_58 [12];
  undefined1 local_4c;
  undefined1 local_34;
  
  if (io == (PHYSFS_Io *)0x0) {
    __assert_fail("io != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/icculus[P]physfs/src/physfs_archiver_hog.c"
                  ,0x76,"void *HOG_openArchive(PHYSFS_Io *, const char *, int, int *)");
  }
  if (forWriting == 0) {
    iVar2 = __PHYSFS_readAll(io,&local_6f,3);
    if (iVar2 == 0) {
      return (void *)0x0;
    }
    if (local_6d == 'F' && local_6f == 0x4844) {
      *claimed = 1;
      opaque = UNPK_openArchive(io,0,1);
      if (opaque == (void *)0x0) {
        return (void *)0x0;
      }
      uVar3 = (*io->length)(io);
      uVar7 = 3;
      do {
        if (uVar3 <= uVar7) {
          return opaque;
        }
        iVar2 = __PHYSFS_readAll(io,local_58,0xd);
        if ((iVar2 == 0) || (iVar2 = readui32(io,&local_6c), uVar5 = local_6c, iVar2 == 0)) break;
        local_4c = 0;
        uVar6 = (int)uVar7 + 0x11;
        pvVar4 = UNPK_addEntry(opaque,local_58,0,-1,-1,(ulong)uVar6,(ulong)local_6c);
        if (pvVar4 == (void *)0x0) break;
        uVar5 = uVar5 + uVar6;
        iVar2 = (*io->seek)(io,(PHYSFS_uint64)uVar5);
        uVar7 = (ulong)uVar5;
      } while (iVar2 != 0);
LAB_0010d271:
      UNPK_abandonArchive(opaque);
      return (void *)0x0;
    }
    if (local_6d == 'G' && local_6f == 0x4f48) {
      iVar2 = __PHYSFS_readAll(io,&local_6f,1);
      if (iVar2 == 0) {
        return (void *)0x0;
      }
      if ((char)local_6f == '2') {
        *claimed = 1;
        opaque = UNPK_openArchive(io,0,1);
        if (opaque == (void *)0x0) {
          return (void *)0x0;
        }
        iVar2 = readui32(io,&local_6c);
        if (((iVar2 != 0) && (iVar2 = readui32(io,&local_60), iVar2 != 0)) &&
           (iVar2 = (*io->seek)(io,0x44), iVar2 != 0)) {
          if (local_6c == 0) {
            return opaque;
          }
          uVar5 = local_6c;
          uVar6 = local_60;
          while (((iVar2 = __PHYSFS_readAll(io,local_58,0x24), iVar2 != 0 &&
                  (iVar2 = readui32(io,&local_5c), iVar2 != 0)) &&
                 ((iVar2 = readui32(io,&local_64), iVar2 != 0 &&
                  (iVar2 = readui32(io,&local_68), uVar1 = local_64, iVar2 != 0))))) {
            local_34 = 0;
            pvVar4 = UNPK_addEntry(opaque,local_58,0,(ulong)local_68,(ulong)local_68,(ulong)uVar6,
                                   (ulong)local_64);
            if (pvVar4 == (void *)0x0) break;
            uVar6 = uVar1 + uVar6;
            uVar5 = uVar5 - 1;
            if (uVar5 == 0) {
              return opaque;
            }
          }
        }
        goto LAB_0010d271;
      }
    }
    errcode = PHYSFS_ERR_UNSUPPORTED;
  }
  else {
    errcode = PHYSFS_ERR_READ_ONLY;
  }
  PHYSFS_setErrorCode(errcode);
  return (void *)0x0;
}

Assistant:

static void *HOG_openArchive(PHYSFS_Io *io, const char *name,
                             int forWriting, int *claimed)
{
    PHYSFS_uint8 buf[3];
    void *unpkarc = NULL;
    int hog1 = 0;

    assert(io != NULL);  /* shouldn't ever happen. */
    BAIL_IF(forWriting, PHYSFS_ERR_READ_ONLY, NULL);
    BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, buf, 3), NULL);

    if (memcmp(buf, "DHF", 3) == 0)
        hog1 = 1;  /* original HOG (Descent 1 and 2) archive */
    else
    {
        BAIL_IF(memcmp(buf, "HOG", 3) != 0, PHYSFS_ERR_UNSUPPORTED, NULL); /* Not HOG2 */
        BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, buf, 1), NULL);
        BAIL_IF(buf[0] != '2', PHYSFS_ERR_UNSUPPORTED, NULL); /* Not HOG2 */
    } /* else */

    *claimed = 1;

    unpkarc = UNPK_openArchive(io, 0, 1);
    BAIL_IF_ERRPASS(!unpkarc, NULL);

    if (!(hog1 ? hog1LoadEntries(io, unpkarc) : hog2LoadEntries(io, unpkarc)))
    {
        UNPK_abandonArchive(unpkarc);
        return NULL;
    } /* if */

    return unpkarc;
}